

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.h
# Opt level: O2

int32_t icu_63::CollationWeights::lengthOfWeight(uint32_t weight)

{
  int32_t iVar1;
  
  if ((weight & 0xffffff) == 0) {
    iVar1 = 1;
  }
  else {
    if ((short)weight != 0) {
      return 4 - (uint)((char)weight == '\0');
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static inline int32_t lengthOfWeight(uint32_t weight) {
        if((weight&0xffffff)==0) {
            return 1;
        } else if((weight&0xffff)==0) {
            return 2;
        } else if((weight&0xff)==0) {
            return 3;
        } else {
            return 4;
        }
    }